

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

size_t derTSEQEncStop(octet *der,size_t pos,der_anchor_t *anchor)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t len;
  ulong uVar4;
  octet *src;
  
  sVar1 = derTEnc((octet *)0x0,anchor->tag);
  sVar2 = derLEnc((octet *)0x0,anchor->len);
  uVar4 = sVar1 + sVar2 + anchor->pos;
  sVar1 = 0xffffffffffffffff;
  len = pos - uVar4;
  if (uVar4 <= pos) {
    sVar3 = derLEnc((octet *)0x0,len);
    sVar1 = sVar3 - sVar2;
    if (anchor->der != (octet *)0x0) {
      src = der + -len;
      memMove(src + sVar1,src,len);
      sVar2 = derLEnc(src + -sVar2,len);
      if (sVar2 != sVar3) {
        return 0xffffffffffffffff;
      }
    }
  }
  return sVar1;
}

Assistant:

size_t derTSEQEncStop(octet der[], size_t pos, const der_anchor_t* anchor)
{
	size_t t_count;
	size_t l_count;
	size_t len;
	size_t l_count1;
	ASSERT(memIsValid(anchor, sizeof(der_anchor_t)));
	ASSERT(anchor->der == 0 ||
		der != 0 && anchor->der + pos == der + anchor->pos);
	// определить длину вложенных данных
	t_count = derTEnc(0, anchor->tag);
	l_count = derLEnc(0, anchor->len);
	if (anchor->pos + t_count + l_count > pos)
		return SIZE_MAX;
	len = pos - anchor->pos - t_count - l_count;
	l_count1 = derLEnc(0, len);
	// определить величину смещения вложенных данных
	pos = l_count1 - l_count;
	// сдвинуть вложенные данные и уточнить длину
	if (anchor->der)
	{
		ASSERT(anchor->der + t_count == der - len - l_count);
		memMove(der - len + pos, der - len, len);
		if (derLEnc(der - len - l_count, len) != l_count1)
			return SIZE_MAX;
	}
	return pos;
}